

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

int __thiscall TPZSFMatrix<double>::Clear(TPZSFMatrix<double> *this)

{
  long in_RDI;
  
  if ((*(long *)(in_RDI + 0x20) != 0) && (*(void **)(in_RDI + 0x20) != (void *)0x0)) {
    operator_delete(*(void **)(in_RDI + 0x20),8);
  }
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  return 1;
}

Assistant:

int
TPZSFMatrix<TVar> ::Clear()
{
	if ( fElem != NULL )
		delete( fElem );
	
	fElem = NULL;
	this->fRow = this->fCol = 0;
	return( 1 );
}